

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermNode * __thiscall
glslang::TParseContext::declareVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TPublicType *publicType,
          TArraySizes *arraySizes,TIntermTyped *initializer)

{
  int *piVar1;
  TQualifier *this_00;
  TBasicType TVar2;
  TVector<glslang::TArraySize> *pTVar3;
  TIntermediate *pTVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  TTypeParameters *pTVar8;
  TVariable *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermNode *pTVar10;
  pointer pcVar11;
  char *pcVar12;
  TIntermTyped *pTVar13;
  TArraySizes *pTVar14;
  _func_int **pp_Var15;
  TType type;
  TSymbol *symbol;
  TType local_160;
  TType local_c8;
  
  pTVar13 = (TIntermTyped *)arraySizes;
  TType::TType(&local_160,publicType);
  local_160.arraySizes = arraySizes;
  TType::copyArrayInnerSizes(&local_160,publicType->arraySizes);
  arrayOfArrayVersionCheck(this,loc,local_160.arraySizes);
  if (initializer != (TIntermTyped *)0x0) {
    if ((local_160._8_4_ & 0xff) == 0x13) {
      pcVar12 = "ray queries can only be initialized by using the rayQueryInitializeEXT intrinsic:";
    }
    else {
      if ((local_160._8_4_ & 0xff) != 0x14) goto LAB_004b8631;
      pcVar12 = "hit objects cannot be initialized using initializers";
    }
    pTVar13 = (TIntermTyped *)(identifier->_M_dataplus)._M_p;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,pcVar12,"=");
  }
LAB_004b8631:
  if (((uint)local_160._8_4_ >> 0x16 & 1) == 0) {
    if (((uint)local_160._8_4_ >> 0x15 & 1) != 0) {
      pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar4->useVulkanMemoryModel = true;
      TProcesses::addProcess(&pTVar4->processes,"use-vulkan-memory-model");
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->useStorageBuffer = true;
      pcVar12 = "expected four type parameters";
      if (((publicType->typeParameters != (TTypeParameters *)0x0) &&
          (pTVar14 = publicType->typeParameters->arraySizes, pTVar14 != (TArraySizes *)0x0)) &&
         ((pTVar3 = (pTVar14->sizes).sizes, pTVar3 != (TVector<glslang::TArraySize> *)0x0 &&
          (((long)(pTVar3->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pTVar3->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) == 0x40)))) {
        if ((((publicType->basicType - EbtFloat < 3) &&
             (uVar7 = TSmallArrayVector::getDimSize(&pTVar14->sizes,0), uVar7 != 0x10)) &&
            (uVar7 = TSmallArrayVector::getDimSize(&publicType->typeParameters->arraySizes->sizes,0)
            , uVar7 != 0x20)) &&
           (uVar7 = TSmallArrayVector::getDimSize(&publicType->typeParameters->arraySizes->sizes,0),
           uVar7 != 0x40)) {
          pTVar13 = (TIntermTyped *)0x82b9e8;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"expected 16, 32, or 64 bits for first type parameter",
                     (identifier->_M_dataplus)._M_p);
        }
        if ((((publicType->basicType - EbtInt8 & 0xfffffff9) != 0) &&
            ((publicType->basicType - EbtUint8 & 0xfffffff9) != 0)) ||
           ((uVar7 = TSmallArrayVector::getDimSize(&publicType->typeParameters->arraySizes->sizes,0)
            , uVar7 == 8 ||
            ((uVar7 = TSmallArrayVector::getDimSize
                                (&publicType->typeParameters->arraySizes->sizes,0), uVar7 == 0x10 ||
             (uVar7 = TSmallArrayVector::getDimSize
                                (&publicType->typeParameters->arraySizes->sizes,0), uVar7 == 0x20)))
            ))) goto LAB_004b8957;
        pcVar12 = "expected 8, 16, or 32 bits for first type parameter";
      }
      goto LAB_004b893a;
    }
    iVar6 = (*local_160._vptr_TType[7])();
    if (iVar6 != 0x17) {
      iVar6 = (*local_160._vptr_TType[7])();
      if (iVar6 == 0x18) {
        pcVar12 = "expected 1-7 type parameters";
        if ((publicType->typeParameters != (TTypeParameters *)0x0) &&
           ((pTVar3 = (publicType->typeParameters->arraySizes->sizes).sizes,
            pTVar3 == (TVector<glslang::TArraySize> *)0x0 ||
            ((int)((ulong)((long)(pTVar3->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar3->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) < 8))))
        goto LAB_004b8957;
      }
      else if ((local_160._8_4_ & 0x8000000) == 0) {
        if (((publicType->typeParameters == (TTypeParameters *)0x0) ||
            (pTVar3 = (publicType->typeParameters->arraySizes->sizes).sizes,
            pTVar3 == (TVector<glslang::TArraySize> *)0x0)) ||
           ((int)((ulong)((long)(pTVar3->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar3->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) == 0))
        goto LAB_004b8957;
        pcVar12 = "unexpected type parameters";
      }
      else {
        pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar4->useVulkanMemoryModel = true;
        TProcesses::addProcess(&pTVar4->processes,"use-vulkan-memory-model");
        ((this->super_TParseContextBase).super_TParseVersions.intermediate)->useStorageBuffer = true
        ;
        pcVar12 = "expected two type parameters";
        if ((((publicType->typeParameters != (TTypeParameters *)0x0) &&
             (pTVar14 = publicType->typeParameters->arraySizes, pTVar14 != (TArraySizes *)0x0)) &&
            (pTVar3 = (pTVar14->sizes).sizes, pTVar3 != (TVector<glslang::TArraySize> *)0x0)) &&
           (((long)(pTVar3->
                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>)
                   .
                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pTVar3->
                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>)
                   .
                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) == 0x10)) {
          uVar7 = TSmallArrayVector::getDimSize(&pTVar14->sizes,0);
          if (0 < (int)uVar7) goto LAB_004b8957;
          pcVar12 = "expected positive number of components";
        }
      }
      goto LAB_004b893a;
    }
    pcVar12 = "expected 1-2 type parameters";
    if ((publicType->typeParameters == (TTypeParameters *)0x0) ||
       ((pTVar3 = (publicType->typeParameters->arraySizes->sizes).sizes,
        pTVar3 != (TVector<glslang::TArraySize> *)0x0 &&
        (2 < (int)((ulong)((long)(pTVar3->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar3->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4)))))
    goto LAB_004b893a;
  }
  else {
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar4->useVulkanMemoryModel = true;
    TProcesses::addProcess(&pTVar4->processes,"use-vulkan-memory-model");
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->useStorageBuffer = true;
    pTVar8 = publicType->typeParameters;
    if ((((pTVar8 == (TTypeParameters *)0x0) || (pTVar8->arraySizes == (TArraySizes *)0x0)) ||
        (pTVar3 = (pTVar8->arraySizes->sizes).sizes, pTVar3 == (TVector<glslang::TArraySize> *)0x0))
       || (((long)(pTVar3->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pTVar3->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) != 0x40)) {
      pTVar13 = (TIntermTyped *)0x82b9e8;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"unexpected number type parameters",(identifier->_M_dataplus)._M_p);
      pTVar8 = publicType->typeParameters;
      if (pTVar8 == (TTypeParameters *)0x0) goto LAB_004b8957;
    }
    TVar2 = pTVar8->basicType;
    if (((TVar2 - EbtFloat < 3) || (TVar2 == EbtSpirvType)) ||
       (((TVar2 - EbtInt8 & 0xfffffff9) == 0 || ((TVar2 - EbtUint8 & 0xfffffff9) == 0))))
    goto LAB_004b8957;
    pcVar12 = 
    "expected 8, 16, 32, or 64 bit signed or unsigned integer or 16, 32, or 64 bit float type";
LAB_004b893a:
    pTVar13 = (TIntermTyped *)0x82b9e8;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,pcVar12,(identifier->_M_dataplus)._M_p);
  }
LAB_004b8957:
  if (local_160._8_1_ == '\0') {
    pcVar11 = (identifier->_M_dataplus)._M_p;
    pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "illegal use of type \'void\'";
    goto LAB_004b8999;
  }
  if (initializer == (TIntermTyped *)0x0) {
    nonInitConstCheck(this,loc,identifier,&local_160);
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x43])
              (this,loc,"initializer");
  }
  samplerCheck(this,loc,&local_160,identifier,pTVar13);
  transparentOpaqueCheck(this,loc,&local_160,identifier);
  atomicUintCheck(this,loc,&local_160,identifier);
  accStructCheck(this,loc,&local_160,identifier);
  hitObjectNVCheck(this,loc,&local_160,identifier);
  checkAndResizeMeshViewDim(this,loc,&local_160,false);
  if (((local_160.qualifier._8_4_ & 0x7f) == 2) &&
     (iVar6 = (*local_160._vptr_TType[0x32])(&local_160,0x12), (char)iVar6 != '\0')) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"variables with reference type can\'t have qualifier \'const\'","qualifier",
               "");
  }
  if (1 < (ulong)(local_160.qualifier._8_4_ & 0x7f) - 5) {
    iVar6 = (*local_160._vptr_TType[0x32])(&local_160,3);
    if ((char)iVar6 != '\0') {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                (this,loc,"qualifier","float16 types can only be in uniform block or buffer storage"
                );
    }
    iVar6 = (*local_160._vptr_TType[0x32])(&local_160,6);
    if (((char)iVar6 != '\0') ||
       (iVar6 = (*local_160._vptr_TType[0x32])(&local_160,7), (char)iVar6 != '\0')) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                (this,loc,"qualifier",
                 "(u)int16 types can only be in uniform block or buffer storage");
    }
    iVar6 = (*local_160._vptr_TType[0x32])(&local_160,4);
    if (((char)iVar6 != '\0') ||
       (iVar6 = (*local_160._vptr_TType[0x32])(&local_160,5), (char)iVar6 != '\0')) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                (this,loc,"qualifier","(u)int8 types can only be in uniform block or buffer storage"
                );
    }
  }
  if ((local_160.qualifier._8_4_ & 0x7f) == 7) {
    bVar5 = TType::
            contains<glslang::TType::containsCoopMat()const::_lambda(glslang::TType_const*)_1_>
                      (&local_160);
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"qualifier","Cooperative matrix types must not be used in shared memory",
                 "");
    }
  }
  else if ((local_160.qualifier._8_4_ & 0x7f) == 0xf) {
    piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->
              numTaskEXTPayloads;
    *piVar1 = *piVar1 + 1;
  }
  this_00 = &local_160.qualifier;
  if (((((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) &&
       ((local_160.qualifier._8_4_ & 0x7f) < 0x1c)) &&
      ((0xe300008U >> (local_160.qualifier._8_4_ & 0x1f) & 1) != 0)) && (local_160._8_1_ == '\x0f'))
  {
    bVar5 = TQualifier::isArrayedIo
                      (this_00,(this->super_TParseContextBase).super_TParseVersions.language);
    if (bVar5) {
      TType::TType(&local_c8,&local_160,0,false);
      bVar5 = TType::
              contains<glslang::TType::containsArray()const::_lambda(glslang::TType_const*)_1_>
                        (&local_c8);
      if ((bVar5) &&
         (bVar5 = TType::
                  contains<glslang::TType::containsBuiltIn()const::_lambda(glslang::TType_const*)_1_>
                            (&local_c8), !bVar5)) {
        if (local_160.typeName == (TString *)0x0) goto LAB_004b90fc;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "A per vertex structure containing an array is not allowed as input in ES",
                   ((local_160.typeName)->_M_dataplus)._M_p,"");
      }
    }
    else {
      bVar5 = TType::
              contains<glslang::TType::containsArray()const::_lambda(glslang::TType_const*)_1_>
                        (&local_160);
      if ((bVar5) &&
         (bVar5 = TType::
                  contains<glslang::TType::containsBuiltIn()const::_lambda(glslang::TType_const*)_1_>
                            (&local_160), !bVar5)) {
        if (local_160.typeName == (TString *)0x0) goto LAB_004b90fc;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"A structure containing an array is not allowed as input in ES",
                   ((local_160.typeName)->_M_dataplus)._M_p,"");
      }
    }
    bVar5 = TType::
            contains<glslang::TType::containsStructure()const::_lambda(glslang::TType_const*)_1_>
                      (&local_160,(anon_class_8_1_8991fb9c_for_predicate)&local_160);
    if (bVar5) {
      if (local_160.typeName == (TString *)0x0) {
LAB_004b90fc:
        __assert_fail("typeName",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x703,"virtual const TString &glslang::TType::getTypeName() const");
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"A structure containing an struct is not allowed as input in ES",
                 ((local_160.typeName)->_M_dataplus)._M_p,"");
    }
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,"gl_FragCoord");
  if ((iVar6 != 0) &&
     (((publicType->shaderQualifiers).originUpperLeft != false ||
      ((publicType->shaderQualifiers).pixelCenterInteger == true)))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply origin_upper_left and pixel_center_origin to gl_FragCoord",
               "layout qualifier","");
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,"gl_FragDepth");
  if ((iVar6 != 0) && ((publicType->shaderQualifiers).layoutDepth != EldNone)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply depth layout to gl_FragDepth","layout qualifier","");
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,"gl_FragStencilRefARB");
  if ((iVar6 != 0) && ((publicType->shaderQualifiers).layoutStencil != ElsNone)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply depth layout to gl_FragStencilRefARB","layout qualifier","")
    ;
  }
  pTVar14 = (TArraySizes *)&publicType->shaderQualifiers;
  pTVar9 = (TVariable *)
           redeclareBuiltinVariable(this,loc,identifier,this_00,(TShaderQualifiers *)pTVar14);
  local_c8._vptr_TType = (_func_int **)pTVar9;
  if (pTVar9 == (TVariable *)0x0) {
    reservedErrorCheck(this,loc,identifier);
    if (((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
        ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed == true)) &&
       (bVar5 = vkRelaxedRemapUniformVariable
                          (this,loc,identifier,publicType,pTVar14,initializer,&local_160), bVar5)) {
      return (TIntermNode *)0x0;
    }
    inheritGlobalDefaults(this,this_00);
    if (local_160.arraySizes != (TArraySizes *)0x0) goto LAB_004b8e70;
    local_c8._vptr_TType = (_func_int **)declareNonArray(this,loc,identifier,&local_160);
  }
  else {
    inheritGlobalDefaults(this,this_00);
    if (local_160.arraySizes == (TArraySizes *)0x0) {
      iVar6 = (*(pTVar9->super_TSymbol)._vptr_TSymbol[0xc])(pTVar9);
      bVar5 = TType::operator==(&local_160,(TType *)CONCAT44(extraout_var,iVar6));
      if (!bVar5) {
        iVar6 = (*(pTVar9->super_TSymbol)._vptr_TSymbol[3])(pTVar9);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot change the type of","redeclaration",
                   *(undefined8 *)(CONCAT44(extraout_var_00,iVar6) + 8));
      }
    }
    else {
LAB_004b8e70:
      arraySizesCheck(this,loc,this_00,local_160.arraySizes,initializer,false);
      arrayQualifierError(this,loc,this_00);
      arrayError(this,loc,&local_160);
      declareArray(this,loc,identifier,&local_160,(TSymbol **)&local_c8);
      if (initializer != (TIntermTyped *)0x0) {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,1,0x78,"GL_3DL_array_objects","initializer");
        TParseVersions::profileRequires((TParseVersions *)this,loc,8,300,(char *)0x0,"initializer");
      }
    }
  }
  if ((TVariable *)local_c8._vptr_TType == (TVariable *)0x0) {
    return (TIntermNode *)0x0;
  }
  if (initializer == (TIntermTyped *)0x0) {
    pTVar10 = (TIntermNode *)0x0;
  }
  else {
    iVar6 = (*((TSymbol *)local_c8._vptr_TType)->_vptr_TSymbol[9])(local_c8._vptr_TType);
    if ((TVariable *)CONCAT44(extraout_var_01,iVar6) == (TVariable *)0x0) {
      pcVar11 = (identifier->_M_dataplus)._M_p;
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "initializer requires a variable, not a member";
LAB_004b8999:
      (*pp_Var15[0x2d])(this,loc,pcVar12,pcVar11,"");
      return (TIntermNode *)0x0;
    }
    pTVar10 = executeInitializer(this,loc,initializer,(TVariable *)CONCAT44(extraout_var_01,iVar6));
  }
  layoutObjectCheck(this,loc,(TSymbol *)local_c8._vptr_TType);
  fixOffset(this,loc,(TSymbol *)local_c8._vptr_TType);
  return pTVar10;
}

Assistant:

TIntermNode* TParseContext::declareVariable(const TSourceLoc& loc, TString& identifier, const TPublicType& publicType,
    TArraySizes* arraySizes, TIntermTyped* initializer)
{
    // Make a fresh type that combines the characteristics from the individual
    // identifier syntax and the declaration-type syntax.
    TType type(publicType);
    type.transferArraySizes(arraySizes);
    type.copyArrayInnerSizes(publicType.arraySizes);
    arrayOfArrayVersionCheck(loc, type.getArraySizes());

    if (initializer) {
        if (type.getBasicType() == EbtRayQuery) {
            error(loc, "ray queries can only be initialized by using the rayQueryInitializeEXT intrinsic:", "=", identifier.c_str());
        } else if (type.getBasicType() == EbtHitObjectNV) {
            error(loc, "hit objects cannot be initialized using initializers", "=", identifier.c_str());
        }

    }

    if (type.isCoopMatKHR()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes ||
            publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "unexpected number type parameters", identifier.c_str(), "");
        }
        if (publicType.typeParameters) {
            if (!isTypeFloat(publicType.typeParameters->basicType) &&
                !isTypeInt(publicType.typeParameters->basicType) && publicType.typeParameters->basicType != EbtSpirvType) {
                error(loc, "expected 8, 16, 32, or 64 bit signed or unsigned integer or 16, 32, or 64 bit float type", identifier.c_str(), "");
            }
        }
    }
    else if (type.isCoopMatNV()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes || publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "expected four type parameters", identifier.c_str(), "");
        } else {
            if (isTypeFloat(publicType.basicType) &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 16 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 32 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 64) {
                error(loc, "expected 16, 32, or 64 bits for first type parameter", identifier.c_str(), "");
            }
            if (isTypeInt(publicType.basicType) &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 8 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 16 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 32) {
                error(loc, "expected 8, 16, or 32 bits for first type parameter", identifier.c_str(), "");
            }
        }
    } else if (type.isTensorLayoutNV()) {
        if (!publicType.typeParameters || publicType.typeParameters->arraySizes->getNumDims() > 2) {
            error(loc, "expected 1-2 type parameters", identifier.c_str(), "");
        }
    } else if (type.isTensorViewNV()) {
        if (!publicType.typeParameters || publicType.typeParameters->arraySizes->getNumDims() > 7) {
            error(loc, "expected 1-7 type parameters", identifier.c_str(), "");
        }
    } else if (type.isCoopVecNV()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes || publicType.typeParameters->arraySizes->getNumDims() != 1) {
            error(loc, "expected two type parameters", identifier.c_str(), "");
        } else if (publicType.typeParameters->arraySizes->getDimSize(0) <= 0) {
            error(loc, "expected positive number of components", identifier.c_str(), "");
        }
    } else {
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() != 0) {
            error(loc, "unexpected type parameters", identifier.c_str(), "");
        }
    }

    if (voidErrorCheck(loc, identifier, type.getBasicType()))
        return nullptr;

    if (initializer)
        rValueErrorCheck(loc, "initializer", initializer);
    else
        nonInitConstCheck(loc, identifier, type);

    samplerCheck(loc, type, identifier, initializer);
    transparentOpaqueCheck(loc, type, identifier);
    atomicUintCheck(loc, type, identifier);
    accStructCheck(loc, type, identifier);
    hitObjectNVCheck(loc, type, identifier);
    checkAndResizeMeshViewDim(loc, type, /*isBlockMember*/ false);
    if (type.getQualifier().storage == EvqConst && type.containsReference()) {
        error(loc, "variables with reference type can't have qualifier 'const'", "qualifier", "");
    }

    if (type.getQualifier().storage != EvqUniform && type.getQualifier().storage != EvqBuffer) {
        if (type.contains16BitFloat())
            requireFloat16Arithmetic(loc, "qualifier", "float16 types can only be in uniform block or buffer storage");
        if (type.contains16BitInt())
            requireInt16Arithmetic(loc, "qualifier", "(u)int16 types can only be in uniform block or buffer storage");
        if (type.contains8BitInt())
            requireInt8Arithmetic(loc, "qualifier", "(u)int8 types can only be in uniform block or buffer storage");
    }

    if (type.getQualifier().storage == EvqtaskPayloadSharedEXT)
        intermediate.addTaskPayloadEXTCount();
    if (type.getQualifier().storage == EvqShared && type.containsCoopMat())
        error(loc, "qualifier", "Cooperative matrix types must not be used in shared memory", "");

    if (profile == EEsProfile) {
        if (type.getQualifier().isPipeInput() && type.getBasicType() == EbtStruct) {
            if (type.getQualifier().isArrayedIo(language)) {
                TType perVertexType(type, 0);
                if (perVertexType.containsArray() && perVertexType.containsBuiltIn() == false) {
                    error(loc, "A per vertex structure containing an array is not allowed as input in ES", type.getTypeName().c_str(), "");
                }
            }
            else if (type.containsArray() && type.containsBuiltIn() == false) {
                error(loc, "A structure containing an array is not allowed as input in ES", type.getTypeName().c_str(), "");
            }
            if (type.containsStructure())
                error(loc, "A structure containing an struct is not allowed as input in ES", type.getTypeName().c_str(), "");
        }
    }

    if (identifier != "gl_FragCoord" && (publicType.shaderQualifiers.originUpperLeft || publicType.shaderQualifiers.pixelCenterInteger))
        error(loc, "can only apply origin_upper_left and pixel_center_origin to gl_FragCoord", "layout qualifier", "");
    if (identifier != "gl_FragDepth" && publicType.shaderQualifiers.getDepth() != EldNone)
        error(loc, "can only apply depth layout to gl_FragDepth", "layout qualifier", "");
    if (identifier != "gl_FragStencilRefARB" && publicType.shaderQualifiers.getStencil() != ElsNone)
        error(loc, "can only apply depth layout to gl_FragStencilRefARB", "layout qualifier", "");

    // Check for redeclaration of built-ins and/or attempting to declare a reserved name
    TSymbol* symbol = redeclareBuiltinVariable(loc, identifier, type.getQualifier(), publicType.shaderQualifiers);
    if (symbol == nullptr)
        reservedErrorCheck(loc, identifier);

    if (symbol == nullptr && spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed) {
        bool remapped = vkRelaxedRemapUniformVariable(loc, identifier, publicType, arraySizes, initializer, type);

        if (remapped) {
            return nullptr;
        }
    }

    inheritGlobalDefaults(type.getQualifier());

    // Declare the variable
    if (type.isArray()) {
        // Check that implicit sizing is only where allowed.
        arraySizesCheck(loc, type.getQualifier(), type.getArraySizes(), initializer, false);

        if (! arrayQualifierError(loc, type.getQualifier()) && ! arrayError(loc, type))
            declareArray(loc, identifier, type, symbol);

        if (initializer) {
            profileRequires(loc, ENoProfile, 120, E_GL_3DL_array_objects, "initializer");
            profileRequires(loc, EEsProfile, 300, nullptr, "initializer");
        }
    } else {
        // non-array case
        if (symbol == nullptr)
            symbol = declareNonArray(loc, identifier, type);
        else if (type != symbol->getType())
            error(loc, "cannot change the type of", "redeclaration", symbol->getName().c_str());
    }

    if (symbol == nullptr)
        return nullptr;

    // Deal with initializer
    TIntermNode* initNode = nullptr;
    if (symbol != nullptr && initializer) {
        TVariable* variable = symbol->getAsVariable();
        if (! variable) {
            error(loc, "initializer requires a variable, not a member", identifier.c_str(), "");
            return nullptr;
        }
        initNode = executeInitializer(loc, initializer, variable);
    }

    // look for errors in layout qualifier use
    layoutObjectCheck(loc, *symbol);

    // fix up
    fixOffset(loc, *symbol);

    return initNode;
}